

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

CappedArray<char,_5UL> __thiscall kj::_::Stringifier::operator*(Stringifier *this,uchar i)

{
  char *pcVar1;
  char *pcVar2;
  uint8_t *puVar3;
  uint uVar4;
  undefined7 in_register_00000031;
  long lVar6;
  CappedArray<char,_5UL> CVar7;
  uint8_t reverse [4];
  CappedArray<char,_5UL> result;
  ulong uVar5;
  
  result.currentSize = 5;
  if ((int)CONCAT71(in_register_00000031,i) == 0) {
    puVar3 = reverse + 1;
    reverse[0] = '\0';
  }
  else {
    puVar3 = reverse;
    uVar5 = (ulong)i;
    do {
      uVar4 = (uint)uVar5;
      *puVar3 = (char)uVar5 + (char)(uVar5 / 10) * -10;
      puVar3 = puVar3 + 1;
      uVar5 = uVar5 / 10;
    } while (9 < uVar4);
  }
  pcVar1 = result.content;
  pcVar2 = pcVar1;
  if (reverse < puVar3) {
    lVar6 = 0;
    do {
      *pcVar2 = puVar3[lVar6 + -1] + '0';
      pcVar2 = pcVar2 + 1;
      lVar6 = lVar6 + -1;
    } while ((long)reverse - (long)puVar3 != lVar6);
  }
  CVar7.currentSize = (long)pcVar2 - (long)pcVar1;
  CVar7._8_8_ = result._8_8_ & 0xffffffffff;
  return CVar7;
}

Assistant:

inline size_t size() const { return currentSize; }